

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O1

void __thiscall
CryptoUtil_DecryptAes256ToString_Test::~CryptoUtil_DecryptAes256ToString_Test
          (CryptoUtil_DecryptAes256ToString_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(CryptoUtil, DecryptAes256ToString) {
  ByteData key(
      "616975656F616975656F616975656F616975656F616975656F616975656F6169");
  ByteData data(
      "6af0d7adef48de1e90dde0423d4b1ecc72b60ec0a33c716c397bc50f9662b581");
  std::string result = CryptoUtil::DecryptAes256ToString(key.GetBytes(), data);

  EXPECT_STREQ(result.c_str(), "aiueoaiueoaiueoaiueoaiueoaiueoai");
}